

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O3

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::listen_failed_alert,libtorrent::aux::stack_allocator&,char_const(&)[1],libtorrent::operation_t,boost::system::error_code&,libtorrent::socket_type_t>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,char (*args_1) [1],
          operation_t *args_2,error_code *args_3,socket_type_t *args_4)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Head_base<0UL,_char_*,_false> _Var3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  listen_failed_alert *this_00;
  string_view iface;
  
  lVar6 = (long)this->m_size;
  if ((ulong)(long)this->m_capacity < lVar6 + 0x78U) {
    grow_capacity(this,0x78);
    lVar6 = (long)this->m_size;
  }
  _Var3._M_head_impl =
       (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
       super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  uVar5 = -(int)(_Var3._M_head_impl + lVar6) - 0x10U & 7;
  _Var3._M_head_impl[lVar6 + 2] = (char)uVar5;
  *(code **)(_Var3._M_head_impl + lVar6 + 8) = move<libtorrent::listen_failed_alert>;
  this_00 = (listen_failed_alert *)(_Var3._M_head_impl + lVar6 + (ulong)uVar5 + 0x10);
  *(ushort *)(_Var3._M_head_impl + lVar6) = -(short)this_00 - 0x60U & 7 | 0x60;
  sVar4 = strlen(*args_1);
  iface._M_str = *args_1;
  iface._M_len = sVar4;
  listen_failed_alert::listen_failed_alert(this_00,args,iface,*args_2,args_3,*args_4);
  uVar1 = this->m_size;
  uVar2 = this->m_num_items;
  this->m_size = uVar5 + 0x10 + (uint)*(ushort *)(_Var3._M_head_impl + lVar6) + uVar1;
  this->m_num_items = uVar2 + 1;
  return this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

#ifdef TORRENT_ADDRESS_SANITIZER
			std::size_t const hdr_len = sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(header_t) + pad_bytes + sizeof(U)
					, alignof(header_t));

			int const new_size = m_size + int(sizeof(header_t) + pad_bytes + hdr_len);

			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, ptr
				, m_storage.get() + new_size);
#endif

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U), alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
#ifdef TORRENT_ADDRESS_SANITIZER
			TORRENT_ASSERT(m_size == new_size);
#endif
			return *ret;
		}